

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

void __thiscall
QSequentialAnimationGroupPrivate::rewindForwards
          (QSequentialAnimationGroupPrivate *this,AnimationIndex *newAnimationIndex)

{
  int iVar1;
  QAbstractAnimation *pQVar2;
  parameter_type pVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = this->lastLoop;
  pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop)
  ;
  if (pVar3 < iVar1) {
    lVar4 = (long)this->currentAnimationIndex;
    if (-1 < lVar4) {
      do {
        pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4];
        setCurrentAnimation(this,(int)lVar4,true);
        QAbstractAnimation::setCurrentTime(pQVar2,0);
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar5);
    }
    lVar4 = (this->super_QAnimationGroupPrivate).animations.d.size;
    if (lVar4 == 1) {
      activateCurrentAnimation(this,false);
    }
    else {
      setCurrentAnimation(this,(int)lVar4 + -1,true);
    }
  }
  lVar4 = (long)this->currentAnimationIndex;
  if (newAnimationIndex->index < this->currentAnimationIndex) {
    do {
      pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4];
      setCurrentAnimation(this,(int)lVar4,true);
      QAbstractAnimation::setCurrentTime(pQVar2,0);
      lVar4 = lVar4 + -1;
    } while (newAnimationIndex->index < lVar4);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::rewindForwards(const AnimationIndex &newAnimationIndex)
{
    if (lastLoop > currentLoop) {
        // we need to fast rewind to the beginning
        for (int i = currentAnimationIndex; i >= 0 ; --i) {
            QAbstractAnimation *anim = animations.at(i);
            setCurrentAnimation(i, true);
            anim->setCurrentTime(0);
        }
        // this will make sure the current animation is reset to the end
        if (animations.size() == 1)
            // we need to force activation because setCurrentAnimation will have no effect
            activateCurrentAnimation();
        else
            setCurrentAnimation(animations.size() - 1, true);
    }

    // and now we need to fast rewind from the current position to
    for (int i = currentAnimationIndex; i > newAnimationIndex.index; --i) {
        QAbstractAnimation *anim = animations.at(i);
        setCurrentAnimation(i, true);
        anim->setCurrentTime(0);
    }
    // setting the new current animation will happen later
}